

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractsocket.cpp
# Opt level: O3

bool __thiscall QAbstractSocket::waitForReadyRead(QAbstractSocket *this,int msecs)

{
  QAbstractSocketPrivate *this_00;
  char cVar1;
  char cVar2;
  SocketError errorCode;
  long in_FS_OFFSET;
  bool bVar3;
  bool readyToWrite;
  bool readyToRead;
  QString local_68;
  char local_4a;
  char local_49;
  undefined1 local_48 [16];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QAbstractSocketPrivate **)&this->field_0x8;
  if (this_00->state != UnconnectedState) {
    local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QDeadlineTimer::QDeadlineTimer((QDeadlineTimer *)local_48,(long)msecs,CoarseTimer);
    if (*(int *)(*(long *)&this->field_0x8 + 0x260) - 1U < 2) {
      cVar1 = (**(code **)(*(long *)this + 0x130))(this,msecs);
      if (cVar1 == '\0') goto LAB_001c14dc;
    }
    while (*(int *)(*(long *)&this->field_0x8 + 0x260) - 3U < 2) {
      bVar3 = false;
      local_49 = '\0';
      local_4a = '\0';
      if (*(long *)&this_00->field_0x98 != 0) {
        bVar3 = *(long *)(*(long *)&this_00->field_0x98 + 0x18) != 0;
      }
      cVar1 = (**(code **)(*(long *)this_00->socketEngine + 0x130))
                        (this_00->socketEngine,&local_49,&local_4a,1,bVar3,0,local_48._0_4_,
                         local_48._8_4_);
      if (cVar1 == '\0') {
        errorCode = QAbstractSocketEngine::error((QAbstractSocketEngine *)this_00->socketEngine);
        QAbstractSocketEngine::errorString(&local_68,(QAbstractSocketEngine *)this_00->socketEngine)
        ;
        QAbstractSocketPrivate::setErrorAndEmit(this_00,errorCode,&local_68);
        if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,0x10);
          }
        }
        if (this_00->socketError != SocketTimeoutError) {
          (**(code **)(*(long *)this + 0x70))(this);
        }
        goto LAB_001c14de;
      }
      if (local_49 == '\x01') {
        cVar2 = (**(code **)(*(long *)this_00 + 0x70))(this_00);
        if (cVar2 != '\0') goto LAB_001c14de;
      }
      if (local_4a == '\x01') {
        (**(code **)(*(long *)this_00 + 0x88))(this_00);
      }
      cVar1 = QDeadlineTimer::hasExpired();
      if (cVar1 != '\0') break;
    }
  }
LAB_001c14dc:
  cVar1 = '\0';
LAB_001c14de:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (bool)cVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool QAbstractSocket::waitForReadyRead(int msecs)
{
    Q_D(QAbstractSocket);
#if defined (QABSTRACTSOCKET_DEBUG)
    qDebug("QAbstractSocket::waitForReadyRead(%i)", msecs);
#endif

    // require calling connectToHost() before waitForReadyRead()
    if (state() == UnconnectedState) {
        /* If all you have is a QIODevice pointer to an abstractsocket, you cannot check
           this, so you cannot avoid this warning. */
//        qWarning("QAbstractSocket::waitForReadyRead() is not allowed in UnconnectedState");
        return false;
    }

    QDeadlineTimer deadline{msecs};

    // handle a socket in connecting state
    if (state() == HostLookupState || state() == ConnectingState) {
        if (!waitForConnected(msecs))
            return false;
    }

    do {
        if (state() != ConnectedState && state() != BoundState)
            return false;
        Q_ASSERT(d->socketEngine);

        bool readyToRead = false;
        bool readyToWrite = false;
        if (!d->socketEngine->waitForReadOrWrite(&readyToRead, &readyToWrite, true, !d->writeBuffer.isEmpty(),
                                                 deadline)) {
#if defined (QABSTRACTSOCKET_DEBUG)
            qDebug("QAbstractSocket::waitForReadyRead(%i) failed (%i, %s)",
                   msecs, d->socketEngine->error(), d->socketEngine->errorString().toLatin1().constData());
#endif
            d->setErrorAndEmit(d->socketEngine->error(), d->socketEngine->errorString());
            if (d->socketError != SocketTimeoutError)
                close();
            return false;
        }

        if (readyToRead) {
            if (d->canReadNotification())
                return true;
        }

        if (readyToWrite)
            d->canWriteNotification();
    } while (!deadline.hasExpired());
    return false;
}